

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_path_handle_graph.cpp
# Opt level: O2

path_handle_t __thiscall
handlegraph::MutablePathHandleGraph::rename_path
          (MutablePathHandleGraph *this,path_handle_t *path_handle,string *new_name)

{
  __type_conflict _Var1;
  bool bVar2;
  undefined1 uVar3;
  handle_t handle;
  path_handle_t renamed;
  iterator __begin1;
  iterator __end1;
  char local_90 [8];
  path_handle_t local_88;
  PathForEachSocket local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  iterator local_50;
  
  (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0x168)) + 0xb8))
            (&local_70,&this->field_0x0 + *(long *)(*(long *)this + -0x168),path_handle);
  _Var1 = std::operator==(new_name,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (!_Var1) {
    local_88.data = (char  [8])(**(code **)(*(long *)this + 0x158))(this,new_name,0);
    local_80 = PathHandleGraph::scan_path
                         ((PathHandleGraph *)(&this->field_0x0 + *(long *)(*(long *)this + -0x168)),
                          path_handle);
    PathForEachSocket::begin((iterator *)&local_70,&local_80);
    PathForEachSocket::end(&local_50,&local_80);
    while (bVar2 = PathForEachSocket::iterator::operator!=((iterator *)&local_70,&local_50), bVar2)
    {
      local_90 = (char  [8])PathForEachSocket::iterator::operator*((iterator *)&local_70);
      (**(code **)(*(long *)this + 0x168))(this,&local_88,local_90);
      PathForEachSocket::iterator::operator++((iterator *)&local_70);
    }
    uVar3 = (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0x168)) + 0xc0))
                      (&this->field_0x0 + *(long *)(*(long *)this + -0x168),path_handle);
    (**(code **)(*(long *)this + 400))(this,&local_88,uVar3);
    (**(code **)(*(long *)this + 0x148))(this,path_handle);
    path_handle = &local_88;
  }
  return (path_handle_t)*&path_handle->data;
}

Assistant:

path_handle_t MutablePathHandleGraph::rename_path(const path_handle_t& path_handle,
                                                  const std::string& new_name) {
    if (new_name == get_path_name(path_handle)) {
        return path_handle;
    }
    // if no overwritten implementation, just copy the path
    path_handle_t renamed = create_path_handle(new_name);
    for (handle_t handle : scan_path(path_handle)) {
        append_step(renamed, handle);
    }
    set_circularity(renamed, get_is_circular(path_handle));
    destroy_path(path_handle);
    return renamed;
}